

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

void QTest::qtest_qParseArgs(int argc,char **argv,bool qml)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *appname;
  char *testname;
  byte in_DL;
  undefined8 *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  bool addFallbackLogger;
  bool explicitLoggerRequested;
  bool installedTestCoverage;
  int offset;
  int colon;
  char *format;
  char *filename;
  int i;
  char *testOptions;
  char *logFilename;
  int logFormat;
  QString *in_stack_fffffffffffffe88;
  QList<QString> *in_stack_fffffffffffffe90;
  char **in_stack_fffffffffffffe98;
  QBenchmarkGlobalData *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffec0;
  byte in_stack_fffffffffffffec7;
  QString *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  FILE *in_stack_fffffffffffffed8;
  int local_11c;
  int in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  LogMode in_stack_fffffffffffffef4;
  int local_f4;
  int local_e0;
  storage_type *local_c0;
  undefined1 local_98 [24];
  char local_80 [24];
  storage_type *local_68;
  FILE *in_stack_ffffffffffffffa0;
  undefined1 local_58 [48];
  undefined1 local_28 [24];
  QFileInfo local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  local_e0 = -1;
  repetitions = 1;
  QList<QString>::clear(in_stack_fffffffffffffe90);
  QList<QString>::clear(in_stack_fffffffffffffe90);
  local_f4 = 1;
  do {
    if (in_EDI <= local_f4) {
      appname = QTestResult::currentAppName();
      testname = QTestResult::currentTestObjectName();
      bVar2 = installCoverageTool(appname,testname);
      QTestLog::setInstalledTestCoverage(bVar2);
      bVar2 = QTestLog::hasLoggers();
      if ((!bVar2) && (local_e0 != -1)) {
        QTestLog::addLogger(in_stack_fffffffffffffef4,
                            (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      if (local_e0 == -1) {
        QTestLog::addLogger(in_stack_fffffffffffffef4,
                            (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      if ((repetitions != 1) && (bVar2 = QTestLog::isRepeatSupported(), !bVar2)) {
        fprintf(_stderr,"-repeat is only supported with plain text logger\n");
        exit(1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    iVar3 = strcmp((char *)in_RSI[local_f4],"-help");
    if (((iVar3 == 0) || (iVar3 = strcmp((char *)in_RSI[local_f4],"--help"), iVar3 == 0)) ||
       (iVar3 = strcmp((char *)in_RSI[local_f4],"/?"), iVar3 == 0)) {
      printf(" Usage: %s [options] [testfunction[:testdata]]...\n    By default, all testfunctions will be run.\n\n%s"
             ,*in_RSI,
             " New-style logging options:\n -o filename,format  : Output results to file in the specified format\n                       Use - to output to stdout\n                       Valid formats are:\n                         txt      : Plain text\n                         csv      : CSV format (suitable for benchmarks)\n                         junitxml : XML JUnit document\n                         xml      : XML document\n                         lightxml : A stream of XML tags\n                         teamcity : TeamCity format\n                         tap      : Test Anything Protocol\n\n     *** Multiple loggers can be specified, but at most one can log to stdout.\n\n Old-style logging options:\n -o filename         : Write the output into file\n -txt                : Output results in Plain Text\n -csv                : Output results in a CSV format (suitable for benchmarks)\n -junitxml           : Output results as XML JUnit document\n -xml                : Output results as XML document\n -lightxml           : Output results as stream of XML tags\n -teamcity           : Output results in TeamCity format\n -tap                : Output results in Test Anything Protocol format\n\n     *** If no output file is specified, stdout is assumed.\n     *** If no output format is specified, -txt is assumed.\n\n Test log detail options:\n -silent             : Log failures and fatal errors only\n -v1                 : Log the start of each testfunction\n -v2                 : Log each QVERIFY/QCOMPARE/QTEST (implies -v1)\n -vs                 : Log every signal emission and resulting slot invocations\n\n     *** The -silent and -v1 options only affect plain text output.\n\n Testing options:\n -functions          : Returns a list of current testfunctions\n -datatags           : Returns a list of current data tags.\n                       A global data tag is preceded by \' __global__ \'.\n -eventdelay ms      : Set default delay for mouse and keyboard simulation to ms milliseconds\n -keydelay ms        : Set default delay for keyboard simulation to ms milliseconds\n..." /* TRUNCATED STRING LITERAL */
            );
      if (bVar1 != 0) {
        printf(
              "\n QmlTest options:\n -import dir         : Specify an import directory.\n -plugins dir        : Specify a directory where to search for plugins.\n -input dir/file     : Specify the root directory for test cases or a single test case file.\n -translation file   : Specify the translation file.\n -file-selector dir  : Specify a file selector for the QML engine.\n"
              );
      }
      printf("\n -help               : This help\n");
      exit(0);
    }
    iVar3 = strcmp((char *)in_RSI[local_f4],"-functions");
    if (iVar3 == 0) {
      if (bVar1 == 0) {
        qPrintTestSlots(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                        (char *)in_stack_fffffffffffffec8);
        exit(0);
      }
      printAvailableFunctions = 1;
    }
    else {
      iVar3 = strcmp((char *)in_RSI[local_f4],"-datatags");
      if (iVar3 == 0) {
        if (bVar1 == 0) {
          qPrintDataTags(in_stack_ffffffffffffffa0);
          exit(0);
        }
      }
      else {
        iVar3 = strcmp((char *)in_RSI[local_f4],"-txt");
        if (iVar3 == 0) {
          local_e0 = 0;
        }
        else {
          iVar3 = strcmp((char *)in_RSI[local_f4],"-csv");
          if (iVar3 == 0) {
            local_e0 = 4;
          }
          else {
            iVar3 = strcmp((char *)in_RSI[local_f4],"-junitxml");
            if (iVar3 == 0) {
              local_e0 = 3;
            }
            else {
              iVar3 = strcmp((char *)in_RSI[local_f4],"-xunitxml");
              if (iVar3 == 0) {
                fprintf(_stderr,"WARNING: xunitxml is deprecated. Please use junitxml.\n");
                local_e0 = 3;
              }
              else {
                iVar3 = strcmp((char *)in_RSI[local_f4],"-xml");
                if (iVar3 == 0) {
                  local_e0 = 1;
                }
                else {
                  iVar3 = strcmp((char *)in_RSI[local_f4],"-lightxml");
                  if (iVar3 == 0) {
                    local_e0 = 2;
                  }
                  else {
                    iVar3 = strcmp((char *)in_RSI[local_f4],"-teamcity");
                    if (iVar3 == 0) {
                      local_e0 = 5;
                    }
                    else {
                      iVar3 = strcmp((char *)in_RSI[local_f4],"-tap");
                      if (iVar3 == 0) {
                        local_e0 = 6;
                      }
                      else {
                        iVar3 = strcmp((char *)in_RSI[local_f4],"-silent");
                        if (iVar3 == 0) {
                          QTestLog::setVerboseLevel(-1);
                        }
                        else {
                          iVar3 = strcmp((char *)in_RSI[local_f4],"-v1");
                          if (iVar3 == 0) {
                            QTestLog::setVerboseLevel(1);
                          }
                          else {
                            iVar3 = strcmp((char *)in_RSI[local_f4],"-v2");
                            if (iVar3 == 0) {
                              QTestLog::setVerboseLevel(2);
                            }
                            else {
                              iVar3 = strcmp((char *)in_RSI[local_f4],"-vs");
                              if (iVar3 == 0) {
                                QSignalDumper::setEnabled(true);
                              }
                              else {
                                iVar3 = strcmp((char *)in_RSI[local_f4],"-o");
                                if (iVar3 == 0) {
                                  if (in_EDI <= local_f4 + 1) {
                                    fprintf(_stderr,
                                            "-o needs an extra parameter specifying the filename and optional format\n"
                                           );
                                    exit(1);
                                  }
                                  local_f4 = local_f4 + 1;
                                  sVar4 = strlen((char *)in_RSI[local_f4]);
                                  in_stack_fffffffffffffed8 = (FILE *)operator_new__(sVar4 + 1);
                                  sVar4 = strlen((char *)in_RSI[local_f4]);
                                  in_stack_fffffffffffffed0 = (char *)operator_new__(sVar4 + 1);
                                  iVar3 = __isoc99_sscanf(in_RSI[local_f4],"%[^,],%s",
                                                          in_stack_fffffffffffffed8,
                                                          in_stack_fffffffffffffed0);
                                  if (iVar3 != 1) {
                                    iVar3 = strcmp(in_stack_fffffffffffffed0,"txt");
                                    if (iVar3 == 0) {
                                      local_e0 = 0;
                                    }
                                    else {
                                      iVar3 = strcmp(in_stack_fffffffffffffed0,"csv");
                                      if (iVar3 == 0) {
                                        local_e0 = 4;
                                      }
                                      else {
                                        iVar3 = strcmp(in_stack_fffffffffffffed0,"lightxml");
                                        if (iVar3 == 0) {
                                          local_e0 = 2;
                                        }
                                        else {
                                          iVar3 = strcmp(in_stack_fffffffffffffed0,"xml");
                                          if (iVar3 == 0) {
                                            local_e0 = 1;
                                          }
                                          else {
                                            iVar3 = strcmp(in_stack_fffffffffffffed0,"junitxml");
                                            if (iVar3 == 0) {
                                              local_e0 = 3;
                                            }
                                            else {
                                              iVar3 = strcmp(in_stack_fffffffffffffed0,"xunitxml");
                                              if (iVar3 == 0) {
                                                fprintf(_stderr,
                                                  "WARNING: xunitxml is deprecated. Please use junitxml.\n"
                                                  );
                                                local_e0 = 3;
                                              }
                                              else {
                                                iVar3 = strcmp(in_stack_fffffffffffffed0,"teamcity")
                                                ;
                                                if (iVar3 == 0) {
                                                  local_e0 = 5;
                                                }
                                                else {
                                                  iVar3 = strcmp(in_stack_fffffffffffffed0,"tap");
                                                  if (iVar3 != 0) {
                                                    fprintf(_stderr,
                                                  "output format must be one of txt, csv, lightxml, xml, tap, teamcity or junitxml\n"
                                                  );
                                                  exit(1);
                                                  }
                                                  local_e0 = 6;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    iVar3 = strcmp((char *)in_stack_fffffffffffffed8,"-");
                                    if ((iVar3 == 0) &&
                                       (bVar2 = QTestLog::loggerUsingStdout(), bVar2)) {
                                      fprintf(_stderr,"only one logger can log to stdout\n");
                                      exit(1);
                                    }
                                    QTestLog::addLogger(in_stack_fffffffffffffef4,
                                                        (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                                         in_stack_fffffffffffffee8))
                                    ;
                                  }
                                  if (in_stack_fffffffffffffed8 != (FILE *)0x0) {
                                    operator_delete__(in_stack_fffffffffffffed8);
                                  }
                                  if (in_stack_fffffffffffffed0 != (char *)0x0) {
                                    operator_delete__(in_stack_fffffffffffffed0);
                                  }
                                }
                                else {
                                  iVar3 = strcmp((char *)in_RSI[local_f4],"-eventdelay");
                                  if (iVar3 == 0) {
                                    if (in_EDI <= local_f4 + 1) {
                                      fprintf(_stderr,
                                              "-eventdelay needs an extra parameter to indicate the delay(ms)\n"
                                             );
                                      exit(1);
                                    }
                                    local_f4 = local_f4 + 1;
                                    eventDelay = qToInt((char *)in_stack_fffffffffffffe90);
                                  }
                                  else {
                                    iVar3 = strcmp((char *)in_RSI[local_f4],"-keydelay");
                                    if (iVar3 == 0) {
                                      if (in_EDI <= local_f4 + 1) {
                                        fprintf(_stderr,
                                                "-keydelay needs an extra parameter to indicate the delay(ms)\n"
                                               );
                                        exit(1);
                                      }
                                      local_f4 = local_f4 + 1;
                                      keyDelay = qToInt((char *)in_stack_fffffffffffffe90);
                                    }
                                    else {
                                      iVar3 = strcmp((char *)in_RSI[local_f4],"-mousedelay");
                                      if (iVar3 == 0) {
                                        if (in_EDI <= local_f4 + 1) {
                                          fprintf(_stderr,
                                                  "-mousedelay needs an extra parameter to indicate the delay(ms)\n"
                                                 );
                                          exit(1);
                                        }
                                        local_f4 = local_f4 + 1;
                                        mouseDelay = qToInt((char *)in_stack_fffffffffffffe90);
                                      }
                                      else {
                                        iVar3 = strcmp((char *)in_RSI[local_f4],"-maxwarnings");
                                        if (iVar3 == 0) {
                                          if (in_EDI <= local_f4 + 1) {
                                            fprintf(_stderr,
                                                  "-maxwarnings needs an extra parameter with the amount of warnings\n"
                                                  );
                                            exit(1);
                                          }
                                          local_f4 = local_f4 + 1;
                                          iVar3 = qToInt((char *)in_stack_fffffffffffffe90);
                                          QTestLog::setMaxWarnings(iVar3);
                                        }
                                        else {
                                          iVar3 = strcmp((char *)in_RSI[local_f4],"-repeat");
                                          if (iVar3 == 0) {
                                            if (in_EDI <= local_f4 + 1) {
                                              fprintf(_stderr,
                                                  "-repeat needs an extra parameter for the number of repetitions\n"
                                                  );
                                              exit(1);
                                            }
                                            local_f4 = local_f4 + 1;
                                            repetitions = qToInt((char *)in_stack_fffffffffffffe90);
                                          }
                                          else {
                                            iVar3 = strcmp((char *)in_RSI[local_f4],
                                                           "-nocrashhandler");
                                            if (iVar3 == 0) {
                                              Internal::noCrashHandler = 1;
                                            }
                                            else {
                                              iVar3 = strcmp((char *)in_RSI[local_f4],
                                                             "-skipblacklisted");
                                              if (iVar3 == 0) {
                                                skipBlacklisted = 1;
                                              }
                                              else {
                                                iVar3 = strcmp((char *)in_RSI[local_f4],"-callgrind"
                                                              );
                                                if (iVar3 == 0) {
                                                  bVar2 = QBenchmarkValgrindUtils::haveValgrind();
                                                  if (bVar2) {
                                                    in_stack_fffffffffffffec8 = (QString *)local_28;
                                                    QDir::currentPath();
                                                    QFileInfo::QFileInfo
                                                              (local_10,in_stack_fffffffffffffec8);
                                                    in_stack_fffffffffffffec7 =
                                                         QFileInfo::isWritable();
                                                    QFileInfo::~QFileInfo(local_10);
                                                    QString::~QString((QString *)0x14c180);
                                                    if ((in_stack_fffffffffffffec7 & 1) == 0) {
                                                      fprintf(_stderr,
                                                  "WARNING: Current directory not writable. Using the walltime measurer.\n"
                                                  );
                                                  }
                                                  else {
                                                    QBenchmarkGlobalData::setMode
                                                              (in_stack_fffffffffffffea0,
                                                               (Mode)((ulong)
                                                  in_stack_fffffffffffffe98 >> 0x20));
                                                  }
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "WARNING: Valgrind not found or too old. Make sure it is installed and in your path. Using the walltime measurer.\n"
                                                  );
                                                  }
                                                }
                                                else {
                                                  iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                 "-callgrindchild");
                                                  if (iVar3 == 0) {
                                                    QBenchmarkGlobalData::setMode
                                                              (in_stack_fffffffffffffea0,
                                                               (Mode)((ulong)
                                                  in_stack_fffffffffffffe98 >> 0x20));
                                                  QBenchmarkValgrindUtils::outFileBase
                                                            (CONCAT17(in_stack_fffffffffffffec7,
                                                                      in_stack_fffffffffffffec0));
                                                  QString::operator=((QString *)
                                                                     in_stack_fffffffffffffe90,
                                                                     in_stack_fffffffffffffe88);
                                                  QString::~QString((QString *)0x14c279);
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],"-perf")
                                                    ;
                                                    if (iVar3 == 0) {
                                                      bVar2 = QBenchmarkPerfEventsMeasurer::
                                                              isAvailable();
                                                      if (bVar2) {
                                                        QBenchmarkGlobalData::setMode
                                                                  (in_stack_fffffffffffffea0,
                                                                   (Mode)((ulong)
                                                  in_stack_fffffffffffffe98 >> 0x20));
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "WARNING: Linux perf events not available. Using the walltime measurer.\n"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                   "-perfcounter");
                                                    if (iVar3 == 0) {
                                                      if (in_EDI <= local_f4 + 1) {
                                                        fprintf(_stderr,
                                                  "-perfcounter needs an extra parameter with the name of the counter\n"
                                                  );
                                                  exit(1);
                                                  }
                                                  local_f4 = local_f4 + 1;
                                                  QBenchmarkPerfEventsMeasurer::setCounter
                                                            ((char *)in_stack_fffffffffffffec8);
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                   "-perfcounterlist");
                                                    if (iVar3 == 0) {
                                                      QBenchmarkPerfEventsMeasurer::listCounters();
                                                      exit(0);
                                                    }
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                   "-tickcounter");
                                                    if (iVar3 == 0) {
                                                      QBenchmarkGlobalData::setMode
                                                                (in_stack_fffffffffffffea0,
                                                                 (Mode)((ulong)
                                                  in_stack_fffffffffffffe98 >> 0x20));
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                   "-eventcounter");
                                                    if (iVar3 == 0) {
                                                      QBenchmarkGlobalData::setMode
                                                                (in_stack_fffffffffffffea0,
                                                                 (Mode)((ulong)
                                                  in_stack_fffffffffffffe98 >> 0x20));
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                   "-minimumvalue");
                                                    if (iVar3 == 0) {
                                                      if (in_EDI <= local_f4 + 1) {
                                                        fprintf(_stderr,
                                                  "-minimumvalue needs an extra parameter to indicate the minimum time(ms)\n"
                                                  );
                                                  exit(1);
                                                  }
                                                  local_f4 = local_f4 + 1;
                                                  iVar3 = qToInt((char *)in_stack_fffffffffffffe90);
                                                  QBenchmarkGlobalData::current->walltimeMinimum =
                                                       iVar3;
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                   "-minimumtotal");
                                                    if (iVar3 == 0) {
                                                      if (in_EDI <= local_f4 + 1) {
                                                        fprintf(_stderr,
                                                  "-minimumtotal needs an extra parameter to indicate the minimum total measurement\n"
                                                  );
                                                  exit(1);
                                                  }
                                                  local_f4 = local_f4 + 1;
                                                  iVar3 = qToInt((char *)in_stack_fffffffffffffe90);
                                                  QBenchmarkGlobalData::current->minimumTotal =
                                                       iVar3;
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                   "-iterations");
                                                    if (iVar3 == 0) {
                                                      if (in_EDI <= local_f4 + 1) {
                                                        fprintf(_stderr,
                                                  "-iterations needs an extra parameter to indicate the number of iterations\n"
                                                  );
                                                  exit(1);
                                                  }
                                                  local_f4 = local_f4 + 1;
                                                  iVar3 = qToInt((char *)in_stack_fffffffffffffe90);
                                                  QBenchmarkGlobalData::current->iterationCount =
                                                       iVar3;
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],
                                                                   "-median");
                                                    if (iVar3 == 0) {
                                                      if (in_EDI <= local_f4 + 1) {
                                                        fprintf(_stderr,
                                                  "-median needs an extra parameter to indicate the number of median iterations\n"
                                                  );
                                                  exit(1);
                                                  }
                                                  local_f4 = local_f4 + 1;
                                                  iVar3 = qToInt((char *)in_stack_fffffffffffffe90);
                                                  QBenchmarkGlobalData::current->
                                                  medianIterationCount = iVar3;
                                                  }
                                                  else {
                                                    iVar3 = strcmp((char *)in_RSI[local_f4],"-vb");
                                                    if (iVar3 == 0) {
                                                      QBenchmarkGlobalData::current->verboseOutput =
                                                           true;
                                                    }
                                                    else {
                                                      if (*(char *)in_RSI[local_f4] == '-') {
                                                        fprintf(_stderr,
                                                  "Unknown option: \'%s\'\n\n%s",in_RSI[local_f4],
                                                  " New-style logging options:\n -o filename,format  : Output results to file in the specified format\n                       Use - to output to stdout\n                       Valid formats are:\n                         txt      : Plain text\n                         csv      : CSV format (suitable for benchmarks)\n                         junitxml : XML JUnit document\n                         xml      : XML document\n                         lightxml : A stream of XML tags\n                         teamcity : TeamCity format\n                         tap      : Test Anything Protocol\n\n     *** Multiple loggers can be specified, but at most one can log to stdout.\n\n Old-style logging options:\n -o filename         : Write the output into file\n -txt                : Output results in Plain Text\n -csv                : Output results in a CSV format (suitable for benchmarks)\n -junitxml           : Output results as XML JUnit document\n -xml                : Output results as XML document\n -lightxml           : Output results as stream of XML tags\n -teamcity           : Output results in TeamCity format\n -tap                : Output results in Test Anything Protocol format\n\n     *** If no output file is specified, stdout is assumed.\n     *** If no output format is specified, -txt is assumed.\n\n Test log detail options:\n -silent             : Log failures and fatal errors only\n -v1                 : Log the start of each testfunction\n -v2                 : Log each QVERIFY/QCOMPARE/QTEST (implies -v1)\n -vs                 : Log every signal emission and resulting slot invocations\n\n     *** The -silent and -v1 options only affect plain text output.\n\n Testing options:\n -functions          : Returns a list of current testfunctions\n -datatags           : Returns a list of current data tags.\n                       A global data tag is preceded by \' __global__ \'.\n -eventdelay ms      : Set default delay for mouse and keyboard simulation to ms milliseconds\n -keydelay ms        : Set default delay for keyboard simulation to ms milliseconds\n..." /* TRUNCATED STRING LITERAL */
                                                  );
                                                  if (bVar1 != 0) {
                                                    fprintf(_stderr,
                                                  "\nqmltest related options:\n -import    : Specify an import directory.\n -plugins   : Specify a directory where to search for plugins.\n -input     : Specify the root directory for test cases.\n"
                                                  );
                                                  }
                                                  fprintf(_stderr,"\n -help      : This help\n");
                                                  exit(1);
                                                  }
                                                  for (local_11c = 0; in_stack_fffffffffffffee8 = -1
                                                      , *(char *)(in_RSI[local_f4] + (long)local_11c
                                                                 ) != '\0';
                                                      local_11c = local_11c + 1) {
                                                    if (*(char *)(in_RSI[local_f4] + (long)local_11c
                                                                 ) == ':') {
                                                      in_stack_fffffffffffffee8 = local_11c;
                                                      if (*(char *)(in_RSI[local_f4] +
                                                                   (long)(local_11c + 1)) != ':')
                                                      break;
                                                      local_11c = local_11c + 1;
                                                    }
                                                  }
                                                  if (in_stack_fffffffffffffee8 == -1) {
                                                    QByteArrayView::
                                                    QByteArrayView<const_char_*,_true>
                                                              ((QByteArrayView *)
                                                               in_stack_fffffffffffffea0,
                                                               in_stack_fffffffffffffe98);
                                                    QVar5.m_data = local_68;
                                                    QVar5.m_size = (qsizetype)local_58;
                                                    QString::fromLatin1(QVar5);
                                                    QList<QString>::operator+=
                                                              (in_stack_fffffffffffffe90,
                                                               in_stack_fffffffffffffe88);
                                                    QString::~QString((QString *)0x14c843);
                                                    in_stack_fffffffffffffeb0 = local_80;
                                                    QString::QString((QString *)0x14c855);
                                                    QList<QString>::operator+=
                                                              (in_stack_fffffffffffffe90,
                                                               in_stack_fffffffffffffe88);
                                                    QString::~QString((QString *)0x14c875);
                                                  }
                                                  else {
                                                    QString::fromLatin1(in_stack_fffffffffffffeb0,
                                                                        (qsizetype)local_98);
                                                    QList<QString>::operator+=
                                                              (in_stack_fffffffffffffe90,
                                                               in_stack_fffffffffffffe88);
                                                    QString::~QString((QString *)0x14c90d);
                                                    QByteArrayView::
                                                    QByteArrayView<const_char_*,_true>
                                                              ((QByteArrayView *)
                                                               in_stack_fffffffffffffea0,
                                                               in_stack_fffffffffffffe98);
                                                    in_stack_fffffffffffffea0 =
                                                         (QBenchmarkGlobalData *)
                                                         &stack0xffffffffffffff50;
                                                    QVar6.m_data = local_c0;
                                                    QVar6.m_size = (qsizetype)
                                                                   in_stack_fffffffffffffea0;
                                                    QString::fromLatin1(QVar6);
                                                    QList<QString>::operator+=
                                                              (in_stack_fffffffffffffe90,
                                                               in_stack_fffffffffffffe88);
                                                    QString::~QString((QString *)0x14c98a);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_f4 = local_f4 + 1;
  } while( true );
}

Assistant:

Q_TESTLIB_EXPORT void qtest_qParseArgs(int argc, const char *const argv[], bool qml)
{
    int logFormat = -1; // Not set
    const char *logFilename = nullptr;

    repetitions = 1;

    QTest::testFunctions.clear();
    QTest::testTags.clear();

#if defined(Q_OS_DARWIN) && defined(HAVE_XCTEST)
    if (QXcodeTestLogger::canLogTestProgress())
        logFormat = QTestLog::XCTest;
#endif

    const char *testOptions =
         " New-style logging options:\n"
         " -o filename,format  : Output results to file in the specified format\n"
         "                       Use - to output to stdout\n"
         "                       Valid formats are:\n"
         "                         txt      : Plain text\n"
         "                         csv      : CSV format (suitable for benchmarks)\n"
         "                         junitxml : XML JUnit document\n"
         "                         xml      : XML document\n"
         "                         lightxml : A stream of XML tags\n"
         "                         teamcity : TeamCity format\n"
         "                         tap      : Test Anything Protocol\n"
         "\n"
         "     *** Multiple loggers can be specified, but at most one can log to stdout.\n"
         "\n"
         " Old-style logging options:\n"
         " -o filename         : Write the output into file\n"
         " -txt                : Output results in Plain Text\n"
         " -csv                : Output results in a CSV format (suitable for benchmarks)\n"
         " -junitxml           : Output results as XML JUnit document\n"
         " -xml                : Output results as XML document\n"
         " -lightxml           : Output results as stream of XML tags\n"
         " -teamcity           : Output results in TeamCity format\n"
         " -tap                : Output results in Test Anything Protocol format\n"
         "\n"
         "     *** If no output file is specified, stdout is assumed.\n"
         "     *** If no output format is specified, -txt is assumed.\n"
         "\n"
         " Test log detail options:\n"
         " -silent             : Log failures and fatal errors only\n"
         " -v1                 : Log the start of each testfunction\n"
         " -v2                 : Log each QVERIFY/QCOMPARE/QTEST (implies -v1)\n"
         " -vs                 : Log every signal emission and resulting slot invocations\n"
         "\n"
         "     *** The -silent and -v1 options only affect plain text output.\n"
         "\n"
         " Testing options:\n"
         " -functions          : Returns a list of current testfunctions\n"
         " -datatags           : Returns a list of current data tags.\n"
         "                       A global data tag is preceded by ' __global__ '.\n"
         " -eventdelay ms      : Set default delay for mouse and keyboard simulation to ms milliseconds\n"
         " -keydelay ms        : Set default delay for keyboard simulation to ms milliseconds\n"
         " -mousedelay ms      : Set default delay for mouse simulation to ms milliseconds\n"
         " -maxwarnings n      : Sets the maximum amount of messages to output.\n"
         "                       0 means unlimited, default: 2000\n"
         " -nocrashhandler     : Disables the crash handler. Useful for debugging crashes.\n"
         " -repeat n           : Run the testsuite n times or until the test fails.\n"
         "                       Useful for finding flaky tests. If negative, the tests are\n"
         "                       repeated forever. This is intended as a developer tool, and\n"
         "                       is only supported with the plain text logger.\n"
         " -skipblacklisted    : Skip blacklisted tests. Useful for measuring test coverage.\n"
         "\n"
         " Benchmarking options:\n"
#if QT_CONFIG(valgrind)
         " -callgrind          : Use callgrind to time benchmarks\n"
#endif
#ifdef QTESTLIB_USE_PERF_EVENTS
         " -perf               : Use Linux perf events to time benchmarks\n"
         " -perfcounter name   : Use the counter named 'name'\n"
         " -perfcounterlist    : Lists the counters available\n"
#endif
#ifdef HAVE_TICK_COUNTER
         " -tickcounter        : Use CPU tick counters to time benchmarks\n"
#endif
         " -eventcounter       : Counts events received during benchmarks\n"
         " -minimumvalue n     : Sets the minimum acceptable measurement value\n"
         " -minimumtotal n     : Sets the minimum acceptable total for repeated executions of a test function\n"
         " -iterations  n      : Sets the number of accumulation iterations.\n"
         " -median  n          : Sets the number of median iterations.\n"
         " -vb                 : Print out verbose benchmarking information.\n";

    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "-help") == 0 || strcmp(argv[i], "--help") == 0
            || strcmp(argv[i], "/?") == 0) {
            std::printf(" Usage: %s [options] [testfunction[:testdata]]...\n"
                        "    By default, all testfunctions will be run.\n\n"
                        "%s", argv[0], testOptions);

            if (qml) {
                std::printf("\n"
                            " QmlTest options:\n"
                            " -import dir         : Specify an import directory.\n"
                            " -plugins dir        : Specify a directory where to search for plugins.\n"
                            " -input dir/file     : Specify the root directory for test cases or a single test case file.\n"
                            " -translation file   : Specify the translation file.\n"
                            " -file-selector dir  : Specify a file selector for the QML engine.\n");
            }

            std::printf("\n"
                        " -help               : This help\n");
            exit(0);
        } else if (strcmp(argv[i], "-functions") == 0) {
            if (qml) {
                QTest::printAvailableFunctions = true;
            } else {
                qPrintTestSlots(stdout);
                exit(0);
            }
        } else if (strcmp(argv[i], "-datatags") == 0) {
            if (!qml) {
                qPrintDataTags(stdout);
                exit(0);
            }
        } else if (strcmp(argv[i], "-txt") == 0) {
            logFormat = QTestLog::Plain;
        } else if (strcmp(argv[i], "-csv") == 0) {
            logFormat = QTestLog::CSV;
        } else if (strcmp(argv[i], "-junitxml") == 0)  {
            logFormat = QTestLog::JUnitXML;
        } else if (strcmp(argv[i], "-xunitxml") == 0)  {
            std::fprintf(stderr, "WARNING: xunitxml is deprecated. Please use junitxml.\n");
            logFormat = QTestLog::JUnitXML;
        } else if (strcmp(argv[i], "-xml") == 0) {
            logFormat = QTestLog::XML;
        } else if (strcmp(argv[i], "-lightxml") == 0) {
            logFormat = QTestLog::LightXML;
        } else if (strcmp(argv[i], "-teamcity") == 0) {
            logFormat = QTestLog::TeamCity;
        } else if (strcmp(argv[i], "-tap") == 0) {
            logFormat = QTestLog::TAP;
        } else if (strcmp(argv[i], "-silent") == 0) {
            QTestLog::setVerboseLevel(-1);
        } else if (strcmp(argv[i], "-v1") == 0) {
            QTestLog::setVerboseLevel(1);
        } else if (strcmp(argv[i], "-v2") == 0) {
            QTestLog::setVerboseLevel(2);
        } else if (strcmp(argv[i], "-vs") == 0) {
            QSignalDumper::setEnabled(true);
        } else if (strcmp(argv[i], "-o") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-o needs an extra parameter specifying the filename and optional format\n");
                exit(1);
            }
            ++i;
            // Do we have the old or new style -o option?
            char *filename = new char[strlen(argv[i])+1];
            char *format = new char[strlen(argv[i])+1];
            if (std::sscanf(argv[i], "%[^,],%s", filename, format) == 1) {
                // Old-style
                logFilename = argv[i];
            } else {
                // New-style
                if (strcmp(format, "txt") == 0)
                    logFormat = QTestLog::Plain;
                else if (strcmp(format, "csv") == 0)
                    logFormat = QTestLog::CSV;
                else if (strcmp(format, "lightxml") == 0)
                    logFormat = QTestLog::LightXML;
                else if (strcmp(format, "xml") == 0)
                    logFormat = QTestLog::XML;
                else if (strcmp(format, "junitxml") == 0)
                    logFormat = QTestLog::JUnitXML;
                else if (strcmp(format, "xunitxml") == 0) {
                    std::fprintf(stderr, "WARNING: xunitxml is deprecated. Please use junitxml.\n");
                    logFormat = QTestLog::JUnitXML;
                } else if (strcmp(format, "teamcity") == 0)
                    logFormat = QTestLog::TeamCity;
                else if (strcmp(format, "tap") == 0)
                    logFormat = QTestLog::TAP;
                else {
                    std::fprintf(stderr, "output format must be one of txt, csv, lightxml, xml, tap, teamcity or junitxml\n");
                    exit(1);
                }
                if (strcmp(filename, "-") == 0 && QTestLog::loggerUsingStdout()) {
                    std::fprintf(stderr, "only one logger can log to stdout\n");
                    exit(1);
                }
                QTestLog::addLogger(QTestLog::LogMode(logFormat), filename);
            }
            delete [] filename;
            delete [] format;
        } else if (strcmp(argv[i], "-eventdelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-eventdelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::eventDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-keydelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-keydelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::keyDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-mousedelay") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-mousedelay needs an extra parameter to indicate the delay(ms)\n");
                exit(1);
            } else {
                QTest::mouseDelay = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-maxwarnings") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-maxwarnings needs an extra parameter with the amount of warnings\n");
                exit(1);
            } else {
                QTestLog::setMaxWarnings(qToInt(argv[++i]));
            }
        } else if (strcmp(argv[i], "-repeat") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-repeat needs an extra parameter for the number of repetitions\n");
                exit(1);
            } else {
                repetitions = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-nocrashhandler") == 0) {
            QTest::Internal::noCrashHandler = true;
        } else if (strcmp(argv[i], "-skipblacklisted") == 0) {
            QTest::skipBlacklisted = true;
#if QT_CONFIG(valgrind)
        } else if (strcmp(argv[i], "-callgrind") == 0) {
            if (!QBenchmarkValgrindUtils::haveValgrind()) {
                std::fprintf(stderr,
                             "WARNING: Valgrind not found or too old. "
                             "Make sure it is installed and in your path. "
                             "Using the walltime measurer.\n");
            } else if (QFileInfo(QDir::currentPath()).isWritable()) {
                QBenchmarkGlobalData::current->setMode(
                    QBenchmarkGlobalData::CallgrindParentProcess);
            } else {
                std::fprintf(stderr,
                             "WARNING: Current directory not writable. "
                             "Using the walltime measurer.\n");
            }
        } else if (strcmp(argv[i], "-callgrindchild") == 0) { // "private" option
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::CallgrindChildProcess);
            QBenchmarkGlobalData::current->callgrindOutFileBase =
                QBenchmarkValgrindUtils::outFileBase();
#endif
#ifdef QTESTLIB_USE_PERF_EVENTS
        } else if (strcmp(argv[i], "-perf") == 0) {
            if (QBenchmarkPerfEventsMeasurer::isAvailable()) {
                // perf available
                QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::PerfCounter);
            } else {
                std::fprintf(stderr, "WARNING: Linux perf events not available. Using the walltime measurer.\n");
            }
        } else if (strcmp(argv[i], "-perfcounter") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-perfcounter needs an extra parameter with the name of the counter\n");
                exit(1);
            } else {
                QBenchmarkPerfEventsMeasurer::setCounter(argv[++i]);
            }
        } else if (strcmp(argv[i], "-perfcounterlist") == 0) {
            QBenchmarkPerfEventsMeasurer::listCounters();
            exit(0);
#endif
#ifdef HAVE_TICK_COUNTER
        } else if (strcmp(argv[i], "-tickcounter") == 0) {
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::TickCounter);
#endif
        } else if (strcmp(argv[i], "-eventcounter") == 0) {
            QBenchmarkGlobalData::current->setMode(QBenchmarkGlobalData::EventCounter);
        } else if (strcmp(argv[i], "-minimumvalue") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-minimumvalue needs an extra parameter to indicate the minimum time(ms)\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->walltimeMinimum = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-minimumtotal") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-minimumtotal needs an extra parameter to indicate the minimum total measurement\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->minimumTotal = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-iterations") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-iterations needs an extra parameter to indicate the number of iterations\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->iterationCount = qToInt(argv[++i]);
            }
        } else if (strcmp(argv[i], "-median") == 0) {
            if (i + 1 >= argc) {
                std::fprintf(stderr, "-median needs an extra parameter to indicate the number of median iterations\n");
                exit(1);
            } else {
                QBenchmarkGlobalData::current->medianIterationCount = qToInt(argv[++i]);
            }

        } else if (strcmp(argv[i], "-vb") == 0) {
            QBenchmarkGlobalData::current->verboseOutput = true;
#if defined(Q_OS_DARWIN)
        } else if (strncmp(argv[i], "-Apple", 6) == 0) {
            i += 1; // Skip Apple-specific user preferences
            continue;
# if defined(HAVE_XCTEST)
        } else if (int skip = QXcodeTestLogger::parseCommandLineArgument(argv[i])) {
            i += (skip - 1); // Eating argv[i] with a continue counts towards skips
            continue;
# endif
#endif
        } else if (argv[i][0] == '-') {
            std::fprintf(stderr, "Unknown option: '%s'\n\n%s", argv[i], testOptions);
            if (qml) {
                std::fprintf(stderr, "\nqmltest related options:\n"
                                     " -import    : Specify an import directory.\n"
                                     " -plugins   : Specify a directory where to search for plugins.\n"
                                     " -input     : Specify the root directory for test cases.\n");
            }

            std::fprintf(stderr, "\n"
                                 " -help      : This help\n");
            exit(1);
        } else {
            // We can't check the availability of test functions until
            // we load the QML files.  So just store the data for now.
            int colon = -1;
            int offset;
            for (offset = 0; argv[i][offset]; ++offset) {
                if (argv[i][offset] == ':') {
                    if (argv[i][offset + 1] == ':') {
                        // "::" is used as a test name separator.
                        // e.g. "ClickTests::test_click:row1".
                        ++offset;
                    } else {
                        colon = offset;
                        break;
                    }
                }
            }
            if (colon == -1) {
                QTest::testFunctions += QString::fromLatin1(argv[i]);
                QTest::testTags += QString();
            } else {
                QTest::testFunctions +=
                    QString::fromLatin1(argv[i], colon);
                QTest::testTags +=
                    QString::fromLatin1(argv[i] + colon + 1);
            }
        }
    }

    bool installedTestCoverage = installCoverageTool(QTestResult::currentAppName(), QTestResult::currentTestObjectName());
    QTestLog::setInstalledTestCoverage(installedTestCoverage);

    // If no loggers were created by the long version of the -o command-line
    // option, but a logger was requested via the old-style option, add it.
    const bool explicitLoggerRequested = logFormat != -1;
    if (!QTestLog::hasLoggers() && explicitLoggerRequested)
        QTestLog::addLogger(QTestLog::LogMode(logFormat), logFilename);

    bool addFallbackLogger = !explicitLoggerRequested;

#if defined(QT_USE_APPLE_UNIFIED_LOGGING)
    // Any explicitly requested loggers will be added by now, so we can check if they use stdout
    const bool safeToAddAppleLogger = !AppleUnifiedLogger::preventsStderrLogging() || !QTestLog::loggerUsingStdout();
    if (safeToAddAppleLogger && QAppleTestLogger::debugLoggingEnabled()) {
        QTestLog::addLogger(QTestLog::Apple, nullptr);
        if (AppleUnifiedLogger::preventsStderrLogging() && !logFilename)
            addFallbackLogger = false; // Prevent plain test logger fallback below
    }
#endif

    if (addFallbackLogger)
        QTestLog::addLogger(QTestLog::Plain, logFilename);

    if (repetitions != 1 && !QTestLog::isRepeatSupported()) {
        std::fprintf(stderr, "-repeat is only supported with plain text logger\n");
        exit(1);
    }
}